

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_bool_acc_or2(void)

{
  int iVar1;
  char *local_48;
  char *args [2];
  uint expected_bits;
  uint c;
  uint b;
  uint a;
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  cargo._4_4_ = 0;
  iVar1 = cargo_init((cargo_t *)&b,0,"program");
  if (iVar1 == 0) {
    c = 0;
    expected_bits = 0;
    args[1]._4_4_ = 0;
    args[1]._0_4_ = 0;
    local_48 = "program";
    args[0] = "-cbaccbcb";
    cargo._4_4_ = cargo_add_option(_b,0,"--alpha -a",(char *)0x0,"b|",&c,1,2);
    if (cargo._4_4_ == 0) {
      cargo._4_4_ = cargo_add_option(_b,0,"--beta -b",(char *)0x0,"b|",&expected_bits,2,2,4);
      if (cargo._4_4_ == 0) {
        cargo._4_4_ = cargo_add_option(_b,0,"--centauri -c",(char *)0x0,"b|",(long)args + 0xc,4,2,4,
                                       0x20,4);
        if (cargo._4_4_ == 0) {
          cargo._4_4_ = cargo_parse(_b,0,1,2,&local_48);
          if (cargo._4_4_ == 0) {
            args[1]._0_4_ = 2;
            printf("a = Expect: 0x%x Got: 0x%x\n",2,(ulong)c);
            if ((c & (uint)args[1]) == (uint)args[1]) {
              if (c == (uint)args[1]) {
                args[1]._0_4_ = 6;
                printf("b = Expect: 0x%x Got: 0x%x\n",6,(ulong)expected_bits);
                if ((expected_bits & (uint)args[1]) == (uint)args[1]) {
                  if (expected_bits == (uint)args[1]) {
                    args[1]._0_4_ = 0x26;
                    printf("c = Expect: 0x%x Got: 0x%x\n",0x26,(ulong)args[1]._4_4_);
                    if ((args[1]._4_4_ & (uint)args[1]) == (uint)args[1]) {
                      if (args[1]._4_4_ != (uint)args[1]) {
                        pcStack_18 = "Expected no other bit than 1, 2 and 5 to be set";
                      }
                    }
                    else {
                      pcStack_18 = "Expected bit 1, 2 and 5 to be set";
                    }
                  }
                  else {
                    pcStack_18 = "Expected no other bit than 1 and 2 to be set";
                  }
                }
                else {
                  pcStack_18 = "Expected bit 1 and 2 to be set";
                }
              }
              else {
                pcStack_18 = "Expected no other bit than 1 to be set";
              }
            }
            else {
              pcStack_18 = "Expected bit 1 to be set";
            }
          }
          else {
            pcStack_18 = "Parse failed";
          }
        }
        else {
          pcStack_18 = "Failed to add option";
        }
      }
      else {
        pcStack_18 = "Failed to add option";
      }
    }
    else {
      pcStack_18 = "Failed to add option";
    }
    cargo_destroy((cargo_t *)&b);
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_bool_acc_or2)
{
    unsigned int a = 0;
    unsigned int b = 0;
    unsigned int c = 0;
    unsigned int expected_bits = 0;
    char *args[] = { "program", "-cbaccbcb"};

    ret = cargo_add_option(cargo, 0, "--alpha -a", NULL,
            "b|", &a, 1, (1 << 1));
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--beta -b", NULL,
            "b|", &b, 2, (1 << 1), (1 << 2));
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_add_option(cargo, 0, "--centauri -c", NULL,
            "b|", &c, 4, (1 << 1), (1 << 2), (1 << 5), (1 << 2));
    cargo_assert(ret == 0, "Failed to add option");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failed");

    expected_bits = (1 << 1);
    printf("a = Expect: 0x%x Got: 0x%x\n", expected_bits, a);
    cargo_assert((a & expected_bits) == expected_bits, "Expected bit 1 to be set");
    cargo_assert((a ^ expected_bits) == 0, "Expected no other bit than 1 to be set");

    // We have 3 occurrances of "-b" but only 2 bits should still be set.
    expected_bits = (1 << 1) | (1 << 2);
    printf("b = Expect: 0x%x Got: 0x%x\n", expected_bits, b);
    cargo_assert((b & (expected_bits)) == expected_bits, "Expected bit 1 and 2 to be set");
    cargo_assert((b ^ (expected_bits)) == 0, "Expected no other bit than 1 and 2 to be set");

    expected_bits = (1 << 1) | (1 << 2) | (1 << 5);
    printf("c = Expect: 0x%x Got: 0x%x\n", expected_bits, c);
    cargo_assert((c & expected_bits) == expected_bits, "Expected bit 1, 2 and 5 to be set");
    cargo_assert((c ^ expected_bits) == 0, "Expected no other bit than 1, 2 and 5 to be set");

    _TEST_CLEANUP();
}